

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTex2D
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  ChannelOrder CVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  TestLog *log;
  bool bVar4;
  ContextWrapper *this_00;
  bool bVar5;
  int i;
  uint uVar6;
  RenderTarget *pRVar7;
  long lVar8;
  TextureFormat *pTVar9;
  uint uVar10;
  TextureFormat *pTVar11;
  uint uVar12;
  ChannelOrder CVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  TextureFormat *pTVar17;
  void *pvVar18;
  int height;
  Vector<bool,_4> res_1;
  Vector<int,_4> res_2;
  IVec4 accurateFmtBits;
  Surface result;
  Surface reference;
  Vector<int,_4> res_4;
  IVec4 pixelFormatBits;
  IVec4 compareBits;
  UVec4 threshold;
  IVec4 texFormatBits;
  char local_140 [4];
  uint local_13c;
  ChannelOrder local_138 [2];
  uint auStack_130 [2];
  TextureFormat local_128;
  undefined8 uStack_120;
  ulong local_118;
  TextureFormat local_110;
  Surface local_108;
  Surface local_f0;
  byte local_d8 [16];
  ContextWrapper *local_c8;
  ReferenceContext *local_c0;
  GLContext *local_b8;
  ConstPixelBufferAccess local_b0;
  TextureFormat local_88 [2];
  int local_78 [4];
  UVec4 local_68;
  ConstPixelBufferAccess local_58;
  
  local_13c = 1;
  if ((this->m_flags & 1) != 0) {
    uVar10 = this->m_width;
    uVar6 = 0x20;
    uVar12 = 0x20;
    if (uVar10 != 0) {
      uVar12 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = uVar12 ^ 0x1f;
    }
    uVar10 = this->m_height;
    if (uVar10 != 0) {
      uVar6 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    iVar16 = 0x1f - uVar6;
    if ((int)(0x1f - uVar6) < (int)(0x1f - uVar12)) {
      iVar16 = 0x1f - uVar12;
    }
    local_13c = iVar16 + 1;
  }
  if (0 < (int)local_13c) {
    local_c8 = &this->super_ContextWrapper;
    local_118 = 0;
    local_c0 = refContext;
    local_b8 = gles2Context;
    do {
      iVar15 = this->m_width >> ((byte)local_118 & 0x1f);
      iVar16 = 1;
      if (1 < iVar15) {
        iVar16 = iVar15;
      }
      iVar14 = this->m_height >> ((byte)local_118 & 0x1f);
      height = 1;
      if (1 < iVar14) {
        height = iVar14;
      }
      tcu::Surface::Surface(&local_f0);
      tcu::Surface::Surface(&local_108);
      this_00 = local_c8;
      bVar4 = false;
      if (2 < iVar14 && 2 < iVar15) {
        sglr::ContextWrapper::setContext(local_c8,&local_b8->super_Context);
        renderTex2D(this,&local_108,iVar16,height);
        sglr::ContextWrapper::setContext(this_00,&local_c0->super_Context);
        renderTex2D(this,&local_f0,iVar16,height);
        pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
        local_110 = this->m_texFormat;
        tcu::getTextureFormatBitDepth((tcu *)&local_58,&local_110);
        local_b0.m_format.order = (pRVar7->m_pixelFormat).redBits;
        if (local_110.order - L < 2) {
          local_b0.m_format.type = local_b0.m_format.order;
          local_b0.m_size.m_data[0] = local_b0.m_format.order;
          local_b0.m_size.m_data[1] = (pRVar7->m_pixelFormat).alphaBits;
        }
        else {
          uVar2 = (pRVar7->m_pixelFormat).greenBits;
          uVar3 = (pRVar7->m_pixelFormat).blueBits;
          local_b0.m_format.type = uVar2;
          local_b0.m_size.m_data[0] = uVar3;
          local_b0.m_size.m_data[1] = (pRVar7->m_pixelFormat).alphaBits;
        }
        local_128.order = R;
        local_128.type = SNORM_INT8;
        uStack_120 = 0;
        lVar8 = 0;
        do {
          CVar1 = local_b0.m_size.m_data[lVar8 + -2];
          CVar13 = local_58.m_size.m_data[lVar8 + -2];
          if ((int)CVar1 < (int)CVar13) {
            CVar13 = CVar1;
          }
          (&local_128.order)[lVar8] = CVar13;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        lVar8 = 0;
        do {
          (&local_88[0].order)[lVar8] = RGBA;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        local_d8[3] = 0;
        local_d8[4] = 0;
        local_d8[5] = 0;
        local_d8[6] = 0;
        local_d8[7] = 0;
        local_d8[8] = 0;
        local_d8[9] = 0;
        local_d8[10] = 0;
        local_d8[0xb] = 0;
        local_d8[0xc] = 0;
        local_d8[0xd] = 0;
        local_d8[0xe] = 0;
        local_d8[0xf] = 0;
        local_140[0] = '\0';
        local_140[1] = '\0';
        local_140[2] = '\0';
        local_140[3] = '\0';
        lVar8 = 0;
        do {
          local_140[lVar8] = *(int *)(local_d8 + lVar8 * 4) < (int)(&local_128.order)[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_138[0] = R;
        local_138[1] = R;
        auStack_130[0] = 0;
        auStack_130[1] = 0;
        pTVar9 = &local_128;
        pTVar11 = local_88;
        lVar8 = 0;
        do {
          pTVar17 = pTVar11;
          if (local_140[lVar8] != '\0') {
            pTVar17 = pTVar9;
          }
          local_138[lVar8] = pTVar17->order;
          lVar8 = lVar8 + 1;
          pTVar11 = (TextureFormat *)&pTVar11->type;
          pTVar9 = (TextureFormat *)&pTVar9->type;
        } while (lVar8 != 4);
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        lVar8 = 0;
        do {
          local_78[lVar8] = local_138[lVar8] - A;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        lVar8 = 0;
        do {
          (&local_88[0].order)[lVar8] = A;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        local_d8[3] = 0;
        local_d8[4] = 0;
        local_d8[5] = 0;
        local_d8[6] = 0;
        local_d8[7] = 0;
        local_d8[8] = 0;
        local_d8[9] = 0;
        local_d8[10] = 0;
        local_d8[0xb] = 0;
        local_d8[0xc] = 0;
        local_d8[0xd] = 0;
        local_d8[0xe] = 0;
        local_d8[0xf] = 0;
        lVar8 = 0;
        do {
          *(int *)(local_d8 + lVar8 * 4) = 8 - local_78[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_138[0] = 0;
        local_138[1] = 0;
        auStack_130[0] = 0;
        auStack_130[1] = 0;
        lVar8 = 0;
        do {
          local_138[lVar8] = (&local_88[0].order)[lVar8] << (local_d8[lVar8 * 4] & 0x1f);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_68.m_data[0] = local_138[0];
        local_68.m_data[1] = local_138[1];
        local_68.m_data[2] = auStack_130[0];
        local_68.m_data[3] = auStack_130[1];
        log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_b0.m_format.order = RGBA;
        local_b0.m_format.type = UNORM_INT8;
        pvVar18 = (void *)local_f0.m_pixels.m_cap;
        if ((void *)local_f0.m_pixels.m_cap != (void *)0x0) {
          pvVar18 = local_f0.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_58,&local_b0.m_format,local_f0.m_width,
                   local_f0.m_height,1,pvVar18);
        local_128.order = RGBA;
        local_128.type = UNORM_INT8;
        pvVar18 = (void *)local_108.m_pixels.m_cap;
        if ((void *)local_108.m_pixels.m_cap != (void *)0x0) {
          pvVar18 = local_108.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_b0,&local_128,local_108.m_width,local_108.m_height,1,
                   pvVar18);
        bVar5 = tcu::intThresholdCompare
                          (log,"Result","Image comparison result",&local_58,&local_b0,&local_68,
                           COMPARE_LOG_ON_ERROR - ((int)local_118 == 0));
        bVar4 = false;
        if (!bVar5) {
          bVar4 = true;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed");
        }
      }
      tcu::Surface::~Surface(&local_108);
      tcu::Surface::~Surface(&local_f0);
    } while ((!bVar4) &&
            (uVar10 = (int)local_118 + 1, local_118 = (ulong)uVar10, uVar10 != local_13c));
  }
  return;
}

Assistant:

void TextureSpecCase::verifyTex2D (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_2D);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		if (levelW <= 2 || levelH <= 2)
			continue; // Don't bother checking.

		// Render with GLES2
		setContext(&gles2Context);
		renderTex2D(result, levelW, levelH);

		// Render reference.
		setContext(&refContext);
		renderTex2D(reference, levelW, levelH);

		{
			tcu::UVec4	threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			bool		isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}
	}
}